

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O2

void __thiscall
btAxisSweep3Internal<unsigned_short>::sortMinDown
          (btAxisSweep3Internal<unsigned_short> *this,int axis,unsigned_short edge,
          btDispatcher *param_3,bool updateOverlaps)

{
  short *psVar1;
  ushort uVar2;
  btOverlappingPairCallback *pbVar3;
  long lVar4;
  bool bVar5;
  Edge EVar6;
  long lVar7;
  uint axis0;
  undefined6 in_register_00000012;
  Handle *pHandleB;
  Edge *pEVar8;
  long lVar9;
  Handle *pHandleA;
  int axis1;
  int axis2;
  
  lVar9 = (long)axis;
  pEVar8 = this->m_pEdges[lVar9] + (CONCAT62(in_register_00000012,edge) & 0xffffffff);
  pHandleA = this->m_pHandles + pEVar8->m_handle;
  axis0 = 1 << ((byte)axis & 0x1f) & 3;
  EVar6.m_handle = 0;
  EVar6.m_pos = pEVar8->m_pos;
  lVar4 = 0x42;
  for (; uVar2 = pEVar8[-1].m_pos, EVar6.m_pos < uVar2; pEVar8 = pEVar8 + -1) {
    pHandleB = this->m_pHandles + pEVar8[-1].m_handle;
    lVar7 = 0x3c;
    if ((uVar2 & 1) != 0) {
      lVar7 = lVar4;
    }
    if (((byte)uVar2 & 1 & updateOverlaps) == 1) {
      bVar5 = testOverlap2D(this,pHandleA,pHandleB,axis0,1 << (sbyte)axis0 & 3);
      lVar7 = lVar4;
      if (bVar5) {
        (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[2])
                  (this->m_pairCache,pHandleA,pHandleB);
        pbVar3 = this->m_userPairCallback;
        if (pbVar3 != (btOverlappingPairCallback *)0x0) {
          (*pbVar3->_vptr_btOverlappingPairCallback[2])(pbVar3,pHandleA,pHandleB);
        }
      }
    }
    psVar1 = (short *)((long)(pHandleB->super_btBroadphaseProxy).m_aabbMin.m_floats +
                      lVar9 * 2 + lVar7 + -0x1c);
    *psVar1 = *psVar1 + 1;
    pHandleA->m_maxEdges[lVar9 + -3] = pHandleA->m_maxEdges[lVar9 + -3] - 1;
    EVar6 = *pEVar8;
    *pEVar8 = pEVar8[-1];
    pEVar8[-1] = EVar6;
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMinDown(int axis, BP_FP_INT_TYPE edge, btDispatcher* /* dispatcher */, bool updateOverlaps)
{

	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pPrev = pEdge - 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pEdge->m_pos < pPrev->m_pos)
	{
		Handle* pHandlePrev = getHandle(pPrev->m_handle);

		if (pPrev->IsMax())
		{
			// if previous edge is a maximum check the bounds and add an overlap if necessary
			const int axis1 = (1  << axis) & 3;
			const int axis2 = (1  << axis1) & 3;
			if (updateOverlaps && testOverlap2D(pHandleEdge, pHandlePrev,axis1,axis2))
			{
				m_pairCache->addOverlappingPair(pHandleEdge,pHandlePrev);
				if (m_userPairCallback)
					m_userPairCallback->addOverlappingPair(pHandleEdge,pHandlePrev);

				//AddOverlap(pEdge->m_handle, pPrev->m_handle);

			}

			// update edge reference in other handle
			pHandlePrev->m_maxEdges[axis]++;
		}
		else
			pHandlePrev->m_minEdges[axis]++;

		pHandleEdge->m_minEdges[axis]--;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pPrev;
		*pPrev = swap;

		// decrement
		pEdge--;
		pPrev--;
	}

#ifdef DEBUG_BROADPHASE
	debugPrintAxis(axis);
#endif //DEBUG_BROADPHASE

}